

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser.cpp
# Opt level: O0

shared_ptr<Node>
ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
          (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *current,
          __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> end,
          uint precedence)

{
  initializer_list<std::pair<const_LogicalOperation,_unsigned_int>_> __l;
  bool bVar1;
  bool bVar2;
  pointer pTVar3;
  logic_error *plVar4;
  mapped_type *pmVar5;
  uint in_ECX;
  undefined4 in_register_00000014;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  shared_ptr<Node> sVar7;
  shared_ptr<Node> local_f8;
  shared_ptr<LogicalOperationNode> local_e8;
  uint local_d4;
  undefined1 local_d0 [4];
  mapped_type current_precedence;
  LogicalOperation logical_operation;
  LogicalOperation local_c4 [3];
  pair<const_LogicalOperation,_unsigned_int> local_b8;
  pair<const_LogicalOperation,_unsigned_int> local_b0;
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
  precedences;
  shared_ptr<Node> local_60 [2];
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *local_40;
  shared_ptr<Node> local_38;
  byte local_25;
  uint local_24;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> _Stack_20;
  uint precedence_local;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *current_local;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> end_local;
  shared_ptr<Node> *left;
  
  current_local =
       (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
       CONCAT44(in_register_00000014,precedence);
  local_24 = in_ECX;
  _Stack_20._M_current = end._M_current;
  end_local._M_current = (Token *)current;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                     end._M_current,
                     (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                     &current_local);
  if (bVar1) {
    std::shared_ptr<Node>::shared_ptr((shared_ptr<Node> *)current);
    _Var6._M_pi = extraout_RDX;
  }
  else {
    local_25 = 0;
    std::shared_ptr<Node>::shared_ptr((shared_ptr<Node> *)current);
    pTVar3 = __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
             operator->((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                        _Stack_20._M_current);
    if (pTVar3->type == PAREN_LEFT) {
      __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                 _Stack_20._M_current);
      local_40 = current_local;
      ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                 &local_38,_Stack_20,(uint)current_local);
      std::shared_ptr<Node>::operator=((shared_ptr<Node> *)current,&local_38);
      std::shared_ptr<Node>::~shared_ptr(&local_38);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                         _Stack_20._M_current,
                         (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                         &current_local);
      if ((bVar1) ||
         (pTVar3 = __gnu_cxx::
                   __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
                   operator->((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                               *)_Stack_20._M_current), pTVar3->type != PAREN_RIGHT)) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar4,"Missing right paren");
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                 _Stack_20._M_current);
    }
    else {
      precedences._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)current_local;
      ParseComparison<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)local_60
                 ,_Stack_20);
      std::shared_ptr<Node>::operator=((shared_ptr<Node> *)current,local_60);
      std::shared_ptr<Node>::~shared_ptr(local_60);
    }
    local_c4[2] = 0;
    local_c4[1] = 1;
    std::pair<const_LogicalOperation,_unsigned_int>::pair<LogicalOperation,_int,_true>
              (&local_b8,local_c4 + 2,(int *)(local_c4 + 1));
    local_c4[0] = And;
    logical_operation = 2;
    std::pair<const_LogicalOperation,_unsigned_int>::pair<LogicalOperation,_int,_true>
              (&local_b0,local_c4,(int *)&logical_operation);
    local_a8 = &local_b8;
    local_a0 = 2;
    std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>::allocator
              ((allocator<std::pair<const_LogicalOperation,_unsigned_int>_> *)
               ((long)&current_precedence + 2));
    __l._M_len = local_a0;
    __l._M_array = local_a8;
    std::
    map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
    ::map((map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
           *)local_98,__l,(less<LogicalOperation> *)((long)&current_precedence + 3),
          (allocator<std::pair<const_LogicalOperation,_unsigned_int>_> *)
          ((long)&current_precedence + 2));
    std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>::~allocator
              ((allocator<std::pair<const_LogicalOperation,_unsigned_int>_> *)
               ((long)&current_precedence + 2));
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                         _Stack_20._M_current,
                         (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                         &current_local);
      bVar1 = false;
      if (bVar2) {
        pTVar3 = __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                 ::operator->((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                               *)_Stack_20._M_current);
        bVar1 = pTVar3->type != PAREN_RIGHT;
      }
      if (!bVar1) break;
      pTVar3 = __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
               operator->((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *
                          )_Stack_20._M_current);
      if (pTVar3->type != LOGICAL_OP) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar4,"Expected logic operation");
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pTVar3 = __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
               operator->((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *
                          )_Stack_20._M_current);
      bVar1 = std::operator==(&pTVar3->value,"AND");
      local_d0 = (undefined1  [4])(uint)bVar1;
      pmVar5 = std::
               map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
               ::at((map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
                     *)local_98,(key_type *)local_d0);
      local_d4 = *pmVar5;
      if (local_d4 <= local_24) break;
      __gnu_cxx::__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_>::operator++
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                 _Stack_20._M_current);
      ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                 &local_f8,_Stack_20,(uint)current_local);
      std::
      make_shared<LogicalOperationNode,LogicalOperation_const&,std::shared_ptr<Node>&,std::shared_ptr<Node>>
                ((LogicalOperation *)&local_e8,(shared_ptr<Node> *)local_d0,
                 (shared_ptr<Node> *)current);
      std::shared_ptr<Node>::operator=((shared_ptr<Node> *)current,&local_e8);
      std::shared_ptr<LogicalOperationNode>::~shared_ptr(&local_e8);
      std::shared_ptr<Node>::~shared_ptr(&local_f8);
    }
    local_25 = 1;
    std::
    map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
    ::~map((map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
            *)local_98);
    _Var6._M_pi = extraout_RDX_00;
    if ((local_25 & 1) == 0) {
      std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)current);
      _Var6._M_pi = extraout_RDX_01;
    }
  }
  sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)current;
  return (shared_ptr<Node>)sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Node> ParseExpression(It& current, It end, unsigned precedence) {
    if (current == end) {
        return shared_ptr<Node>();
    }

    shared_ptr<Node> left;

    if (current->type == TokenType::PAREN_LEFT) {
        ++current; // consume '('
        left = ParseExpression(current, end, 0u);
        if (current == end || current->type != TokenType::PAREN_RIGHT) {
            throw logic_error("Missing right paren");
        }
        ++current; // consume ')'
    } else {
        left = ParseComparison(current, end);
    }

    const map<LogicalOperation, unsigned> precedences = {
        {LogicalOperation::Or, 1},
        {LogicalOperation::And, 2}
    };

    while (current != end && current->type != TokenType::PAREN_RIGHT) {
        if (current->type != TokenType::LOGICAL_OP) {
            throw logic_error("Expected logic operation");
        }

        const auto logical_operation = current->value == "AND" ? LogicalOperation::And
                                                            : LogicalOperation::Or;
        const auto current_precedence = precedences.at(logical_operation);
        if (current_precedence <= precedence) {
            break;
        }

        ++current; // consume op

        left = make_shared<LogicalOperationNode>(
            logical_operation, left, ParseExpression(current, end, current_precedence)
        );
    }

    return left;
}